

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

void __thiscall re2c::Output::Output(Output *this,char *source_name,char *header_name)

{
  char *header_name_local;
  char *source_name_local;
  Output *this_local;
  
  OutputFile::OutputFile(&this->source,source_name);
  HeaderFile::HeaderFile(&this->header,header_name);
  memset(&this->types,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->types);
  memset(&this->skeletons,0,0x30);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->skeletons);
  this->max_fill = 1;
  return;
}

Assistant:

Output::Output (const char * source_name, const char * header_name)
	: source (source_name)
	, header (header_name)
	, types ()
	, skeletons ()
	, max_fill (1)
{}